

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

void insert_node(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  int iVar1;
  char cVar2;
  uint local_24;
  vmd_bst_t *pvStack_20;
  int dir;
  vmd_bst_node_t *i;
  vmd_bst_node_t *node_local;
  vmd_bst_t *tree_local;
  
  local_24 = 0;
  node->field_0x20 = node->field_0x20 & 0xf8;
  node->child[1] = (vmd_bst_node_t *)0x0;
  node->child[0] = (vmd_bst_node_t *)0x0;
  pvStack_20 = tree;
  while ((pvStack_20->head).child[(int)local_24] != (vmd_bst_node_t *)0x0) {
    pvStack_20 = (vmd_bst_t *)(pvStack_20->head).child[(int)local_24];
    iVar1 = (*tree->cmp)(&node->field_0x21,&(pvStack_20->head).field_0x21);
    local_24 = (uint)(-1 < iVar1);
  }
  set_child(&pvStack_20->head,local_24,node);
  update_to_top(tree,node);
  for (; pvStack_20 != tree; pvStack_20 = (vmd_bst_t *)(pvStack_20->head).parent) {
    cVar2 = '\x01';
    if (local_24 != 0) {
      cVar2 = -1;
    }
    (pvStack_20->head).field_0x20 =
         (pvStack_20->head).field_0x20 & 0xf8 |
         ((char)((pvStack_20->head).field_0x20 << 5) >> 5) + cVar2 & 7U;
    if (((char)((pvStack_20->head).field_0x20 << 5) >> 5 == '\0') ||
       (iVar1 = rebalance(tree,&pvStack_20->head), iVar1 != 0)) break;
    local_24 = (uint)((byte)(pvStack_20->head).field_0x20 >> 3 & 1);
  }
  if (((byte)node->field_0x20 >> 4 & 1) != 0) {
    __assert_fail("!node->in_tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c"
                  ,0xe7,"void insert_node(vmd_bst_t *, vmd_bst_node_t *)");
  }
  node->field_0x20 = node->field_0x20 & 0xef | 0x10;
  tree->tree_size = tree->tree_size + 1;
  return;
}

Assistant:

static void
insert_node(bst_t *tree, bst_node_t *node)
{
	bst_node_t *i = &tree->head;
	int dir = 0;

	node->balance = 0;
	node->child[0] = node->child[1] = NULL;

	while (i->child[dir] != NULL) {
		i = i->child[dir];
		dir = (tree->cmp(node->data, i->data) >= 0);
	}

	set_child(i, dir, node);
	update_to_top(tree, node);

	for (; i != &tree->head; i = i->parent) {
		i->balance += (dir ? -1 : 1);
		if (i->balance == 0 || rebalance(tree, i))
			break;
		dir = i->idx;
	}

	assert(!node->in_tree);
	node->in_tree = 1;
	tree->tree_size++;
}